

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O1

int __thiscall
CaDiCaL::Internal::elim_round(Internal *this,bool *completed,bool *deleted_binary_clause)

{
  byte *pbVar1;
  int64_t *piVar2;
  anon_struct_8_2_4505284c_for_terminate *paVar3;
  long *plVar4;
  vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *this_00;
  undefined1 *puVar5;
  int iVar6;
  Flags FVar7;
  Internal *pIVar8;
  pointer ppCVar9;
  Clause *pCVar10;
  pointer pFVar11;
  pointer puVar12;
  Clause **ppCVar13;
  iterator __position;
  int64_t iVar14;
  Terminator *pTVar15;
  double dVar16;
  uint uVar17;
  bool *deleted_binary_clause_00;
  uint *puVar18;
  char cVar19;
  long lVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  time_t *__timer;
  uint uVar27;
  Clause *__range3;
  long lVar28;
  Clause **c;
  pointer ppCVar29;
  Clause **__args;
  bool bVar30;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Instantiator instantiator;
  Eliminator eliminator;
  int local_150;
  Instantiator local_148;
  long local_130;
  bool *local_128;
  int64_t local_120;
  int64_t local_118;
  uint *local_110;
  bool *local_108;
  uint *local_100;
  long local_f8;
  Eliminator local_f0;
  
  local_128 = deleted_binary_clause;
  time(this,(time_t *)completed);
  pIVar8 = this->internal;
  iVar6 = (pIVar8->opts).profile;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if ((this->stable == true) && ((pIVar8->profiles).stable.level <= iVar6)) {
      stop_profiling(pIVar8,&(pIVar8->profiles).stable,dVar16);
    }
    if ((this->stable == false) &&
       (pIVar8 = this->internal, (pIVar8->profiles).unstable.level <= iVar6)) {
      stop_profiling(pIVar8,&(pIVar8->profiles).unstable,dVar16);
    }
    pIVar8 = this->internal;
    if ((pIVar8->profiles).search.level <= iVar6) {
      stop_profiling(pIVar8,&(pIVar8->profiles).search,dVar16);
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  pIVar8 = this->internal;
  if ((pIVar8->profiles).simplify.level <= iVar6) {
    start_profiling(pIVar8,&(pIVar8->profiles).simplify,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  pIVar8 = this->internal;
  if ((pIVar8->profiles).elim.level <= iVar6) {
    start_profiling(pIVar8,&(pIVar8->profiles).elim,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  this->mode = this->mode | 0x220;
  lVar25 = (this->stats).elimrounds + 1;
  (this->stats).elimrounds = lVar25;
  (this->last).elim.marked = (this->stats).mark.elim;
  if ((this->opts).elimlimited == 0) {
    lVar20 = 0x7fffffffffffffff;
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar25,"resolutions unlimited");
    }
  }
  else {
    lVar20 = (long)((double)(this->stats).propagations.search *
                   (double)(this->opts).elimreleff * 0.001);
    lVar24 = (long)(this->opts).elimineff;
    if (lVar24 < lVar20) {
      lVar24 = lVar20;
    }
    lVar20 = (long)(this->opts).elimaxeff;
    if (lVar20 <= lVar24) {
      lVar24 = lVar20;
    }
    lVar28 = (long)(int)(this->stats).active;
    lVar20 = lVar28 * 2;
    if (lVar24 != lVar20 && SBORROW8(lVar24,lVar20) == lVar24 + lVar28 * -2 < 0) {
      lVar20 = lVar24;
    }
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar25,"limit of %ld resolutions",lVar20);
    }
    lVar20 = lVar20 + (this->stats).elimres;
  }
  init_noccs(this);
  ppCVar9 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar29 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar29 != ppCVar9; ppCVar29 = ppCVar29 + 1) {
    pCVar10 = *ppCVar29;
    if ((*(ushort *)&pCVar10->field_0x8 & 0x810) == 0) {
      iVar6 = pCVar10->size;
      lVar25 = (long)iVar6 * 4;
      if ((long)iVar6 == 0) {
        bVar23 = 0;
        bVar30 = false;
      }
      else {
        lVar24 = 0;
        bVar30 = false;
        bVar23 = 0;
        do {
          bVar22 = bVar23;
          if (this->vals[*(int *)((long)&pCVar10[1].field_0 + lVar24)] < '\0') {
            bVar22 = 1;
          }
          if ('\0' < this->vals[*(int *)((long)&pCVar10[1].field_0 + lVar24)]) {
            bVar30 = true;
            bVar22 = bVar23;
          }
          bVar23 = bVar22;
          lVar24 = lVar24 + 4;
        } while (lVar25 - lVar24 != 0);
      }
      if (bVar30) {
        mark_garbage(this,pCVar10);
      }
      else if (iVar6 != 0) {
        lVar24 = 0;
        do {
          uVar26 = *(uint *)((long)&pCVar10[1].field_0 + lVar24);
          uVar27 = -uVar26;
          if (0 < (int)uVar26) {
            uVar27 = uVar26;
          }
          pFVar11 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          FVar7 = pFVar11[uVar27];
          if (((uint)FVar7 & 0x7000000) == 0x1000000) {
            if (((FVar7._1_1_ | ~bVar23) & 1) == 0) {
              piVar2 = &(this->stats).mark.elim;
              *piVar2 = *piVar2 + 1;
              puVar5 = &pFVar11[uVar27].field_0x1;
              *puVar5 = *puVar5 | 1;
            }
            uVar26 = *(uint *)((long)&pCVar10[1].field_0 + lVar24);
            uVar27 = -uVar26;
            if (0 < (int)uVar26) {
              uVar27 = uVar26;
            }
            plVar4 = (this->ntab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar27 << 1 | uVar26 >> 0x1f);
            *plVar4 = *plVar4 + 1;
          }
          lVar24 = lVar24 + 4;
        } while (lVar25 - lVar24 != 0);
      }
    }
  }
  init_occs(this);
  Eliminator::Eliminator(&local_f0,this);
  uVar26 = *(this->vars).n;
  if (uVar26 != 0) {
    uVar27 = 1;
    do {
      uVar17 = -uVar27;
      if (0 < (int)uVar27) {
        uVar17 = uVar27;
      }
      uVar21 = (ulong)uVar17;
      pFVar11 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                _M_impl.super__Vector_impl_data._M_start;
      FVar7 = pFVar11[uVar21];
      if (((uint)FVar7 & 0x7000000) == 0x1000000) {
        puVar12 = (this->frozentab).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar21 < (ulong)((long)(this->frozentab).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 2))
        {
          if ((((uint)FVar7 >> 8 & 1) != 0) && (puVar12[uVar21] == 0)) {
LAB_00820022:
            pFVar11[uVar21] = (Flags)((uint)FVar7 & 0xf9fffeff);
            heap<CaDiCaL::elim_more>::push_back(&local_f0.schedule,uVar27);
          }
        }
        else if (((uint)FVar7 >> 8 & 1) != 0) goto LAB_00820022;
      }
      bVar30 = uVar27 != uVar26;
      uVar27 = uVar27 + 1;
    } while (bVar30);
  }
  shrink_vector<unsigned_int>(&local_f0.schedule.array);
  shrink_vector<unsigned_int>(&local_f0.schedule.pos);
  local_110 = local_f0.schedule.array.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_100 = local_f0.schedule.array.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_130 = (long)local_f0.schedule.array.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f0.schedule.array.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  if (this->internal != (Internal *)0x0) {
    iVar6 = (int)(this->stats).active;
    uVar31 = 0;
    if (iVar6 != 0) {
      uVar31 = SUB84(((double)local_130 * 100.0) / (double)iVar6,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "scheduled %ld variables %.0f%% for elimination",uVar31,local_130);
  }
  ppCVar13 = (this->clauses).
             super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_108 = completed;
  local_f8 = lVar20;
  deleted_binary_clause_00 = local_128;
  for (__args = (this->clauses).
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start; local_128 = deleted_binary_clause_00,
      __args != ppCVar13; __args = __args + 1) {
    pCVar10 = *__args;
    if (((*(ushort *)&pCVar10->field_0x8 & 0x810) == 0) && (iVar6 = pCVar10->size, (long)iVar6 != 0)
       ) {
      lVar25 = 0;
      do {
        uVar26 = *(uint *)((long)&pCVar10[1].field_0 + lVar25);
        uVar27 = -uVar26;
        if (0 < (int)uVar26) {
          uVar27 = uVar26;
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar27] & 0x7000000) == 0x1000000) {
          this_00 = (vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *)
                    ((this->otab).
                     super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar27 << 1 | uVar26 >> 0x1f));
          __position._M_current = *(Clause ***)(this_00 + 8);
          if (__position._M_current == *(Clause ***)(this_00 + 0x10)) {
            std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
            _M_realloc_insert<CaDiCaL::Clause*const&>(this_00,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        lVar25 = lVar25 + 4;
      } while ((long)iVar6 * 4 != lVar25);
    }
    deleted_binary_clause_00 = local_128;
  }
  local_120 = (this->stats).elimres;
  lVar25 = (this->stats).irrlits;
  iVar14 = (this->stats).all.eliminated;
  local_118 = (this->stats).all.fixed;
  if (this->unsat == false) {
    lVar20 = 0;
    do {
      bVar30 = true;
      if (this->termination_forced == false) {
        iVar6 = (this->lim).terminate.forced;
        if ((iVar6 == 0) || ((this->lim).terminate.forced = iVar6 + -1, iVar6 != 1)) {
          pTVar15 = this->external->terminator;
          if (pTVar15 != (Terminator *)0x0) {
            paVar3 = &(this->lim).terminate;
            iVar6 = paVar3->check;
            paVar3->check = paVar3->check + -1;
            if (iVar6 == 0) {
              (this->lim).terminate.check = (this->opts).terminateint;
              cVar19 = (**(code **)(*(long *)pTVar15 + 0x10))();
              if (cVar19 != '\0') goto LAB_00820244;
            }
          }
          bVar30 = false;
        }
        else {
LAB_00820244:
          this->termination_forced = true;
        }
      }
      if (((bVar30) || (local_f8 < (this->stats).elimres)) ||
         (local_f0.schedule.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_f0.schedule.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish)) break;
      uVar26 = *local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      heap<CaDiCaL::elim_more>::pop_front(&local_f0.schedule);
      uVar27 = -uVar26;
      if (0 < (int)uVar26) {
        uVar27 = uVar26;
      }
      pFVar11 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar27;
      *pFVar11 = (Flags)((uint)*pFVar11 & 0xfffffeff);
      try_to_eliminate_variable(this,&local_f0,uVar26,deleted_binary_clause_00);
      if ((lVar25 * 2) / 3 + 0x100000 < (this->stats).garbage.literals) {
        mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
        garbage_collection(this);
      }
      lVar20 = lVar20 + 1;
    } while (this->unsat != true);
  }
  else {
    lVar20 = 0;
  }
  puVar18 = local_100;
  *local_108 = (long)local_f0.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f0.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start == 0;
  if (this->internal != (Internal *)0x0) {
    uVar31 = 0;
    if (local_100 != local_110) {
      uVar31 = SUB84(((double)lVar20 * 100.0) / (double)local_130,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "tried to eliminate %ld variables %.0f%% (%zd remain)",uVar31,lVar20,
          (long)local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2);
  }
  heap<CaDiCaL::elim_more>::erase(&local_f0.schedule);
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->unsat == false) {
    bVar30 = true;
    if (this->termination_forced == false) {
      iVar6 = (this->lim).terminate.forced;
      if ((iVar6 == 0) || ((this->lim).terminate.forced = iVar6 + -1, iVar6 != 1)) {
        pTVar15 = this->external->terminator;
        if (pTVar15 != (Terminator *)0x0) {
          paVar3 = &(this->lim).terminate;
          iVar6 = paVar3->check;
          paVar3->check = paVar3->check + -1;
          if (iVar6 == 0) {
            (this->lim).terminate.check = (this->opts).terminateint;
            cVar19 = (**(code **)(*(long *)pTVar15 + 0x10))();
            if (cVar19 != '\0') goto LAB_008203b8;
          }
        }
        bVar30 = false;
      }
      else {
LAB_008203b8:
        this->termination_forced = true;
      }
    }
    if ((!bVar30) && ((this->opts).instantiate != 0)) {
      collect_instantiation_candidates(this,&local_148);
    }
  }
  reset_occs(this);
  reset_noccs(this);
  if (this->unsat == false) {
    mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
  }
  local_150 = (int)iVar14;
  uVar26 = (int)(this->stats).all.eliminated - local_150;
  if (this->internal != (Internal *)0x0) {
    uVar31 = 0;
    if (puVar18 != local_110) {
      uVar31 = SUB84(((double)(int)uVar26 * 100.0) / (double)local_130,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "eliminated %d variables %.0f%% in %ld resolutions",uVar31,(ulong)uVar26,
          (this->stats).elimres - local_120);
  }
  (this->last).elim.subsumephases = (this->stats).subsumephases;
  __timer = (time_t *)0x65;
  report(this,'e',(uint)((int)local_118 - (int)(this->stats).all.fixed == uVar26 &&
                        (this->opts).reportall == 0));
  time(this,__timer);
  dVar16 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  pIVar8 = this->internal;
  iVar6 = (pIVar8->opts).profile;
  if ((pIVar8->profiles).elim.level <= iVar6) {
    stop_profiling(pIVar8,&(pIVar8->profiles).elim,dVar16);
  }
  pIVar8 = this->internal;
  if ((pIVar8->profiles).simplify.level <= iVar6) {
    stop_profiling(pIVar8,&(pIVar8->profiles).simplify,dVar16);
  }
  this->mode = this->mode & 0xfffffddf;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    pIVar8 = this->internal;
    if ((pIVar8->profiles).search.level <= iVar6) {
      start_profiling(pIVar8,&(pIVar8->profiles).search,dVar16);
    }
    if ((this->stable == true) &&
       (pIVar8 = this->internal, (pIVar8->profiles).stable.level <= iVar6)) {
      start_profiling(pIVar8,&(pIVar8->profiles).stable,dVar16);
    }
    if ((this->stable == false) &&
       (pIVar8 = this->internal, (pIVar8->profiles).unstable.level <= iVar6)) {
      start_profiling(pIVar8,&(pIVar8->profiles).unstable,dVar16);
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((this->unsat != false) || (this->termination_forced != false)) goto LAB_008205f5;
  iVar6 = (this->lim).terminate.forced;
  if ((iVar6 == 0) || ((this->lim).terminate.forced = iVar6 + -1, iVar6 != 1)) {
    pTVar15 = this->external->terminator;
    if (pTVar15 != (Terminator *)0x0) {
      paVar3 = &(this->lim).terminate;
      iVar6 = paVar3->check;
      paVar3->check = paVar3->check + -1;
      if (iVar6 == 0) {
        (this->lim).terminate.check = (this->opts).terminateint;
        cVar19 = (**(code **)(*(long *)pTVar15 + 0x10))();
        if (cVar19 != '\0') goto LAB_008205d3;
      }
    }
    if (local_148.candidates.
        super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.candidates.
        super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      instantiate(this,&local_148);
    }
  }
  else {
LAB_008205d3:
    this->termination_forced = true;
  }
LAB_008205f5:
  if (local_148.candidates.
      super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.candidates.
                    super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.candidates.
                          super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.candidates.
                          super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Eliminator::~Eliminator(&local_f0);
  return uVar26;
}

Assistant:

int Internal::elim_round (bool &completed, bool &deleted_binary_clause) {

  assert (opts.elim);
  assert (!unsat);

  START_SIMPLIFIER (elim, ELIM);
  stats.elimrounds++;

  last.elim.marked = stats.mark.elim;
  assert (!level);

  int64_t resolution_limit;

  if (opts.elimlimited) {
    int64_t delta = stats.propagations.search;
    delta *= 1e-3 * opts.elimreleff;
    if (delta < opts.elimineff)
      delta = opts.elimineff;
    if (delta > opts.elimaxeff)
      delta = opts.elimaxeff;
    delta = max (delta, (int64_t) 2l * active ());

    PHASE ("elim-round", stats.elimrounds,
           "limit of %" PRId64 " resolutions", delta);

    resolution_limit = stats.elimres + delta;
  } else {
    PHASE ("elim-round", stats.elimrounds, "resolutions unlimited");
    resolution_limit = LONG_MAX;
  }

  init_noccs ();

  // First compute the number of occurrences of each literal and at the same
  // time mark satisfied clauses and update 'elim' flags of variables in
  // clauses with root level assigned literals (both false and true).
  //
  for (const auto &c : clauses) {
    if (c->garbage || c->redundant)
      continue;
    bool satisfied = false, falsified = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0)
        satisfied = true;
      else if (tmp < 0)
        falsified = true;
      else
        assert (active (lit));
    }
    if (satisfied)
      mark_garbage (c); // forces more precise counts
    else {
      for (const auto &lit : *c) {
        if (!active (lit))
          continue;
        if (falsified)
          mark_elim (lit); // simulate unit propagation
        noccs (lit)++;
      }
    }
  }

  init_occs ();

  Eliminator eliminator (this);
  ElimSchedule &schedule = eliminator.schedule;

  // Now find elimination candidates which occurred in clauses removed since
  // the last time we ran bounded variable elimination, which in turned
  // triggered their 'elim' bit to be set.
  //
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (frozen (idx))
      continue;
    if (!flags (idx).elim)
      continue;
    flags (idx).elim = false;
    LOG ("scheduling %d for elimination initially", idx);
    schedule.push_back (idx);
  }

  schedule.shrink ();

#ifndef QUIET
  int64_t scheduled = schedule.size ();
#endif

  PHASE ("elim-round", stats.elimrounds,
         "scheduled %" PRId64 " variables %.0f%% for elimination",
         scheduled, percent (scheduled, active ()));

  // Connect irredundant clauses.
  //
  for (const auto &c : clauses)
    if (!c->garbage && !c->redundant)
      for (const auto &lit : *c)
        if (active (lit))
          occs (lit).push_back (c);

#ifndef QUIET
  const int64_t old_resolutions = stats.elimres;
#endif
  const int old_eliminated = stats.all.eliminated;
  const int old_fixed = stats.all.fixed;

  // Limit on garbage literals during variable elimination. If the limit is
  // hit a garbage collection is performed.
  //
  const int64_t garbage_limit = (2 * stats.irrlits / 3) + (1 << 20);

  // Main loops tries to eliminate variables according to the schedule. The
  // schedule is updated dynamically and variables are potentially
  // rescheduled to be tried again if they occur in a removed clause.
  //
#ifndef QUIET
  int64_t tried = 0;
#endif
  while (!unsat && !terminated_asynchronously () &&
         stats.elimres <= resolution_limit && !schedule.empty ()) {
    int idx = schedule.front ();
    schedule.pop_front ();
    flags (idx).elim = false;
    try_to_eliminate_variable (eliminator, idx, deleted_binary_clause);
#ifndef QUIET
    tried++;
#endif
    if (stats.garbage.literals <= garbage_limit)
      continue;
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();
    garbage_collection ();
  }

  // If the schedule is empty all variables have been tried (even
  // rescheduled ones).  Otherwise asynchronous termination happened or we
  // ran into the resolution limit (or derived unsatisfiability).
  //
  completed = !schedule.size ();

  PHASE ("elim-round", stats.elimrounds,
         "tried to eliminate %" PRId64 " variables %.0f%% (%zd remain)",
         tried, percent (tried, scheduled), schedule.size ());

  schedule.erase ();

  // Collect potential literal clause instantiation pairs, which needs full
  // occurrence lists and thus we have it here before resetting them.
  //
  Instantiator instantiator;
  if (!unsat && !terminated_asynchronously () && opts.instantiate)
    collect_instantiation_candidates (instantiator);

  reset_occs ();
  reset_noccs ();

  // Mark all redundant clauses with eliminated variables as garbage.
  //
  if (!unsat)
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();

  int eliminated = stats.all.eliminated - old_eliminated;
#ifndef QUIET
  int64_t resolutions = stats.elimres - old_resolutions;
  PHASE ("elim-round", stats.elimrounds,
         "eliminated %d variables %.0f%% in %" PRId64 " resolutions",
         eliminated, percent (eliminated, scheduled), resolutions);
#endif

  last.elim.subsumephases = stats.subsumephases;
  const int units = stats.all.fixed - old_fixed;
  report ('e', !opts.reportall && !(eliminated + units));
  STOP_SIMPLIFIER (elim, ELIM);

  if (!unsat && !terminated_asynchronously () &&
      instantiator) // Do we have candidate pairs?
    instantiate (instantiator);

  return eliminated; // non-zero if successful
}